

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void avro::parsing::fixup<boost::shared_ptr<avro::Node>>
               (Symbol *s,
               map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               *m,set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                  *seen)

{
  int *piVar1;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar2;
  const_iterator cVar3;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  *pvVar4;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  *ppVar5;
  Exception *this;
  ProductionPtr *p;
  pointer p_00;
  string sStack_58;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_38;
  
  switch(s->kind_) {
  case sRepeater:
    ptVar2 = boost::
             any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&s->extra_);
    fixup_internal<boost::shared_ptr<avro::Node>>(&(ptVar2->super_type).tail.tail.head,m,seen);
    p = &(ptVar2->super_type).tail.tail.tail.head;
    goto LAB_0016550f;
  case sAlternative:
    pvVar4 = boost::
             any_cast<std::vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>>
                       (&s->extra_);
    for (p_00 = (pvVar4->
                super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
        p_00 != (pvVar4->
                super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; p_00 = p_00 + 1) {
      fixup_internal<boost::shared_ptr<avro::Node>>(p_00,m,seen);
    }
    break;
  case sPlaceholder:
    boost::any_cast<boost::shared_ptr<avro::Node>>((boost *)&sStack_58,&s->extra_);
    cVar3 = std::
            _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
            ::find(&m->_M_t,(key_type *)&sStack_58);
    boost::detail::shared_count::~shared_count((shared_count *)&sStack_58._M_string_length);
    if ((_Rb_tree_header *)cVar3._M_node == &(m->_M_t)._M_impl.super__Rb_tree_header) {
      this = (Exception *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_58,"Placeholder symbol cannot be resolved",
                 (allocator<char> *)&local_38);
      Exception::Exception(this,&sStack_58);
      __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
    }
    local_38.px = (element_type *)cVar3._M_node[1]._M_left;
    local_38.pn.pi_ = (sp_counted_base *)cVar3._M_node[1]._M_right;
    if ((_Base_ptr)local_38.pn.pi_ != (_Base_ptr)0x0) {
      LOCK();
      piVar1 = (int *)((long)&((_Base_ptr)local_38.pn.pi_)->_M_parent + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    Symbol::symbolic((Symbol *)&sStack_58,&local_38);
    Symbol::operator=(s,(Symbol *)&sStack_58);
    if ((long *)sStack_58._M_string_length != (long *)0x0) {
      (**(code **)(*(long *)sStack_58._M_string_length + 8))();
    }
    boost::detail::weak_count::~weak_count(&local_38.pn);
    break;
  case sIndirect:
    boost::
    any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              ((boost *)&sStack_58,&s->extra_);
    fixup_internal<boost::shared_ptr<avro::Node>>((ProductionPtr *)&sStack_58,m,seen);
    boost::detail::shared_count::~shared_count((shared_count *)&sStack_58._M_string_length);
    break;
  case sUnionAdjust:
    ppVar5 = boost::
             any_cast<std::pair<unsigned_long,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
                       (&s->extra_);
    p = &ppVar5->second;
LAB_0016550f:
    fixup_internal<boost::shared_ptr<avro::Node>>(p,m,seen);
    return;
  }
  return;
}

Assistant:

Kind kind() const {
        return kind_;
    }